

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::SceneLoader::~SceneLoader(SceneLoader *this)

{
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__SceneLoader_0095e100;
  std::__cxx11::string::~string((string *)&this->mCurrentCharacterData);
  std::tr1::
  _Hashtable<COLLADAFW::UniqueId,_COLLADAFW::UniqueId,_std::allocator<COLLADAFW::UniqueId>,_std::_Identity<COLLADAFW::UniqueId>,_std::equal_to<COLLADAFW::UniqueId>,_std::tr1::hash<COLLADAFW::UniqueId>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
  ::~_Hashtable((_Hashtable<COLLADAFW::UniqueId,_COLLADAFW::UniqueId,_std::allocator<COLLADAFW::UniqueId>,_std::_Identity<COLLADAFW::UniqueId>,_std::equal_to<COLLADAFW::UniqueId>,_std::tr1::hash<COLLADAFW::UniqueId>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                 *)&this->mBoundNodes);
  FilePartLoader::~FilePartLoader(&this->super_FilePartLoader);
  return;
}

Assistant:

SceneLoader::~SceneLoader ()
	{
	}